

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1,int x2)

{
  int iVar1;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined2 local_28;
  short local_26;
  XPoint p [3];
  int x2_local;
  int y1_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  p[1] = (XPoint)x2;
  p[2] = (XPoint)y1;
  iVar1 = clip_x(x);
  local_2c = (undefined2)iVar1;
  local_28 = local_2c;
  iVar1 = clip_x(y);
  local_2a = (undefined2)iVar1;
  iVar1 = clip_x((int)p[2]);
  local_26 = (short)iVar1;
  p[0].y = local_26;
  iVar1 = clip_x((int)p[1]);
  p[0].x = (short)iVar1;
  XDrawLines(fl_display,fl_window,fl_gc,&local_2c,3,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1, int x2) {
#if defined(USE_X11)
  XPoint p[3];
  p[0].x = p[1].x = clip_x(x);  p[0].y = clip_x(y);
  p[1].y = p[2].y = clip_x(y1); p[2].x = clip_x(x2);
  XDrawLines(fl_display, fl_window, fl_gc, p, 3, 0);
#elif defined(WIN32)
  if (x2 > x) x2++;
  else x2--;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x, y1);
  LineTo(fl_gc, x2, y1);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextAddLineToPoint(fl_gc, x2, y1);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x2-0.5, y1  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}